

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void trial::protocol::serialization::
     save_overloader<trial::protocol::json::basic_oarchive<char>,_std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>,_void>
     ::save(basic_oarchive<char> *archive,
           map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *data,
           uint protocol_version)

{
  _Rb_tree_node_base *p_Var1;
  
  json::basic_writer<char,_16UL>::begin_array_value(&archive->writer);
  for (p_Var1 = (data->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(data->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    save_overloader<trial::protocol::json::basic_oarchive<char>,_std::pair<const_int,_bool>,_void>::
    save(archive,(pair<const_int,_bool> *)(p_Var1 + 1),protocol_version);
  }
  json::basic_writer<char,_16UL>::end_array_value(&archive->writer);
  return;
}

Assistant:

static void save(json::basic_oarchive<CharT>& archive,
                     const std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        archive.template save<json::token::begin_array>();
        for (typename std::map<Key, T, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            archive.save_override(*it, protocol_version);
        }
        archive.template save<json::token::end_array>();
    }